

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

double traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                 (vector<IsoTree,_std::allocator<IsoTree>_> *tree,IsoForest *model_outputs,
                 PredictionData<float,_int> *prediction_data,
                 vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
                 ImputedData<int,_double> *imputed_data,double curr_weight,size_t row,int *tree_num,
                 double *tree_depth,size_t curr_lev)

{
  NewCategAction NVar1;
  MissingAction MVar2;
  size_t curr_lev_00;
  pointer pcVar3;
  pointer pcVar4;
  pointer pIVar5;
  double dVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  pointer pIVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  size_t *psVar15;
  size_t *psVar16;
  size_t sVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  if (prediction_data->Xr_indptr == (int *)0x0) {
    if (prediction_data->Xc_indptr == (int *)0x0) {
      uVar9 = (uint)prediction_data->is_col_major;
    }
    else {
      uVar9 = 3;
    }
  }
  else {
    uVar9 = 2;
  }
LAB_0013fb91:
  while( true ) {
    sVar17 = curr_lev;
    pIVar11 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pIVar5 = pIVar11 + sVar17;
    curr_lev_00 = pIVar11[sVar17].tree_left;
    if (curr_lev_00 == 0) {
      if (tree_num != (int *)0x0) {
        tree_num[row] = (int)sVar17;
      }
      if (tree_depth != (double *)0x0) {
        *tree_depth = pIVar5->score;
      }
      if (imputed_data != (ImputedData<int,_double> *)0x0) {
        add_from_impute_node<ImputedData<int,double>>
                  ((impute_nodes->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>).
                   _M_impl.super__Vector_impl_data._M_start + sVar17,imputed_data,curr_weight);
        pIVar11 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      return pIVar11[sVar17].score - 0.0;
    }
    curr_lev = sVar17;
    if (pIVar5->col_type == Categorical) break;
    if (pIVar5->col_type == Numeric) {
      dVar18 = (double)(*(code *)(&DAT_00325598 + *(int *)(&DAT_00325598 + (ulong)uVar9 * 4)))();
      return dVar18;
    }
  }
  psVar15 = &prediction_data->ncols_categ;
  sVar7 = row;
  sVar8 = pIVar5->col_num;
  if (prediction_data->is_col_major != false) {
    psVar15 = &prediction_data->nrows;
    sVar7 = pIVar5->col_num;
    sVar8 = row;
  }
  psVar16 = &pIVar11[sVar17].tree_left;
  uVar12 = prediction_data->categ_data[sVar7 * *psVar15 + sVar8];
  uVar10 = (ulong)(int)uVar12;
  if ((long)uVar10 < 0) {
    MVar2 = model_outputs->missing_action;
    if (MVar2 != Impute) {
      if (MVar2 == Fail) {
        return NAN;
      }
      if (MVar2 == Divide) goto LAB_0013fe27;
      goto LAB_0013fb91;
    }
    if (pIVar5->pct_tree_left < 0.5) goto LAB_0013fda9;
  }
  else {
    if (model_outputs->cat_split_type != SubSet) {
      if (model_outputs->cat_split_type == SingleCateg) {
        if (uVar12 != pIVar5->chosen_cat) goto LAB_0013fda9;
        goto LAB_0013fdb0;
      }
      goto LAB_0013fb91;
    }
    pcVar3 = (pIVar5->cat_split).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar4 = *(pointer *)
              ((long)&(pIVar5->cat_split).
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8);
    if (pcVar3 != pcVar4) {
      NVar1 = model_outputs->new_cat_action;
      iVar13 = (int)pcVar3;
      iVar14 = (int)pcVar4;
      if (NVar1 != Weighted) {
        if (NVar1 == Smallest) {
          if (iVar14 - iVar13 <= (int)uVar12) goto LAB_0013fd9a;
        }
        else {
          if (NVar1 != Random) goto LAB_0013fb91;
          if (iVar14 - iVar13 <= (int)uVar12) {
            uVar12 = (int)uVar12 % (iVar14 - iVar13);
          }
          uVar10 = (ulong)uVar12;
        }
        if (pcVar3[uVar10] != '\0') goto LAB_0013fdb0;
LAB_0013fda9:
        psVar16 = &pIVar5->tree_right;
        goto LAB_0013fdb0;
      }
      if (iVar14 - iVar13 <= (int)uVar12) goto LAB_0013fe27;
      if (pcVar3[uVar10] == '\0') goto LAB_0013fda9;
      curr_lev = curr_lev_00;
      if (pcVar3[uVar10] == -1) {
LAB_0013fe27:
        if (tree_num == (int *)0x0 && tree_depth == (double *)0x0) {
          dVar18 = pIVar5->pct_tree_left;
          dVar19 = traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                             (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                              dVar18 * curr_weight,row,(int *)0x0,(double *)0x0,curr_lev_00);
          pIVar5 = (tree->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar6 = 1.0 - pIVar5[sVar17].pct_tree_left;
          dVar20 = traverse_itree<PredictionData<float,int>,int,ImputedData<int,double>>
                             (tree,model_outputs,prediction_data,impute_nodes,imputed_data,
                              curr_weight * dVar6,row,(int *)0x0,(double *)0x0,
                              pIVar5[sVar17].tree_right);
          return (dVar19 * dVar18 + dVar20 * dVar6) - 0.0;
        }
        throw_unsupported_pred_error();
      }
      goto LAB_0013fb91;
    }
    if (1 < uVar12) {
      if (model_outputs->new_cat_action == Smallest) {
LAB_0013fd9a:
        if (0.5 < pIVar5->pct_tree_left || pIVar5->pct_tree_left == 0.5) goto LAB_0013fda9;
        goto LAB_0013fdb0;
      }
      if (model_outputs->new_cat_action == Weighted) goto LAB_0013fe27;
      goto LAB_0013fb91;
    }
    if (uVar12 != 0) goto LAB_0013fda9;
  }
LAB_0013fdb0:
  curr_lev = *psVar16;
  goto LAB_0013fb91;
}

Assistant:

double traverse_itree(std::vector<IsoTree>     &tree,
                      IsoForest                &model_outputs,
                      PredictionData           &prediction_data,
                      std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                      ImputedData             *imputed_data,     /* only when imputing missing */
                      double                   curr_weight,      /* only when imputing missing */
                      size_t                   row,
                      sparse_ix *restrict      tree_num,
                      double *restrict         tree_depth,
                      size_t                   curr_lev)
{
    double xval;
    int    cval;
    double range_penalty = 0;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
    }

    while (true)
    {
        // if (tree[curr_lev].score >= 0.)
        if (unlikely(tree[curr_lev].tree_left == 0))
        {
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = tree[curr_lev].score;
            if (unlikely(imputed_data != NULL))
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, curr_weight);

            return tree[curr_lev].score - range_penalty;
        }

        else
        {
            switch(tree[curr_lev].col_type)
            {
                case Numeric:
                {
                    switch(numeric_config)
                    {
                        case DenseRowMajor:
                        {
                            xval = prediction_data.numeric_data[tree[curr_lev].col_num + row * prediction_data.ncols_numeric];
                            break;
                        }

                        case DenseColMajor:
                        {
                            xval = prediction_data.numeric_data[row +  tree[curr_lev].col_num * prediction_data.nrows];
                            break;
                        }

                        case SparseCSR:
                        {
                            xval = extract_spR(prediction_data, row_st, row_end, tree[curr_lev].col_num);
                            break;
                        }

                        case SparseCSC:
                        {
                            xval = extract_spC(prediction_data, row, tree[curr_lev].col_num);
                            break;
                        }
                    }

                    if (unlikely(std::isnan(xval)))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        range_penalty += (xval < tree[curr_lev].range_low) || (xval > tree[curr_lev].range_high);
                        curr_lev = (xval <= tree[curr_lev].num_split)?
                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                    }
                    break;
                }

                case Categorical:
                {
                    cval =  prediction_data.categ_data[
                                prediction_data.is_col_major?
                                (row +  tree[curr_lev].col_num * prediction_data.nrows)
                                    :
                                (tree[curr_lev].col_num + row * prediction_data.ncols_categ)
                            ];
                    if (unlikely(cval < 0))
                    {
                        switch(model_outputs.missing_action)
                        {
                            case Divide:
                            {
                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                return
                                    tree[curr_lev].pct_tree_left
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                    + (1. - tree[curr_lev].pct_tree_left)
                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                    - range_penalty;
                            }

                            case Impute:
                            {
                                curr_lev = (tree[curr_lev].pct_tree_left >= .5)?
                                                tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case Fail:
                            {
                                return NAN;
                            }
                        }
                    }

                    else
                    {
                        switch(model_outputs.cat_split_type)
                        {
                            case SingleCateg:
                            {
                                curr_lev = (cval == tree[curr_lev].chosen_cat)?
                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                break;
                            }

                            case SubSet:
                            {

                                if (tree[curr_lev].cat_split.empty())
                                {
                                    if (cval <= 1)
                                    {
                                        curr_lev = (cval == 0)?
                                                    tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                    }

                                    else
                                    {
                                        switch(model_outputs.new_cat_action)
                                        {
                                            case Smallest:
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                                break;
                                            }

                                            case Weighted:
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            default:
                                            {
                                                assert(0);
                                                break;
                                            }
                                        }
                                    }
                                }

                                else
                                {
                                    switch(model_outputs.new_cat_action)
                                    {
                                        case Random:
                                        {
                                            cval = (cval >= (int)tree[curr_lev].cat_split.size())?
                                                    (cval % (int)tree[curr_lev].cat_split.size()) : cval;
                                            curr_lev = (tree[curr_lev].cat_split[cval])?
                                                        tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            break;
                                        }

                                        case Smallest:
                                        {
                                            if (unlikely(cval >= (int)tree[curr_lev].cat_split.size()))
                                            {
                                                curr_lev =  (tree[curr_lev].pct_tree_left < .5)? tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }

                                        case Weighted:
                                        {
                                            if (cval >= (int)tree[curr_lev].cat_split.size()
                                                    ||
                                                tree[curr_lev].cat_split[cval] == (-1))
                                            {
                                                if (tree_num || tree_depth) throw_unsupported_pred_error();
                                                return
                                                    tree[curr_lev].pct_tree_left
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * tree[curr_lev].pct_tree_left,
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_left)
                                                    + (1. - tree[curr_lev].pct_tree_left)
                                                        * traverse_itree(tree, model_outputs, prediction_data,
                                                                         impute_nodes, imputed_data, curr_weight * (1 - tree[curr_lev].pct_tree_left),
                                                                         row, (sparse_ix*)NULL, tree_depth, tree[curr_lev].tree_right)
                                                    - range_penalty;
                                            }

                                            else
                                            {
                                                curr_lev = (tree[curr_lev].cat_split[cval])?
                                                            tree[curr_lev].tree_left : tree[curr_lev].tree_right;
                                            }
                                            break;
                                        }
                                    }
                                }
                                break;
                            }
                        }
                    }
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            }
        }
    }
}